

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::DelayedSequenceExprSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,DelayedSequenceExprSyntax *this,size_t index)

{
  SyntaxNode *local_40;
  size_t index_local;
  DelayedSequenceExprSyntax *this_local;
  
  if (index == 0) {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&this->first->super_SyntaxNode);
  }
  else if (index == 1) {
    local_40 = (SyntaxNode *)0x0;
    if (this != (DelayedSequenceExprSyntax *)0xffffffffffffffe8) {
      local_40 = &(this->elements).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_40);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax DelayedSequenceExprSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return first;
        case 1: return &elements;
        default: return nullptr;
    }
}